

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

void cfd::api::json::ElementsDecodeRawTransactionTxOut::CollectFieldName(void)

{
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> func_table;
  _Any_data local_f8;
  undefined1 local_e8 [16];
  code *local_d8 [2];
  code *local_c8;
  code *pcStack_c0;
  code *local_b8 [2];
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  if (json_mapper_abi_cxx11_._40_8_ == 0) {
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_68 = (code *)0x0;
    uStack_60 = 0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_88 = (code *)0x0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetValueString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetValueString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetValueFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [6])0x5ee81d,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"value","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetValue_minimumString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetValue_minimumString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetValue_minimumFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[14],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [14])"value-minimum",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"value-minimum","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetValue_maximumString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetValue_maximumString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetValue_maximumFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[14],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [14])"value-maximum",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"value-maximum","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetCt_exponentString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetCt_exponentString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetCt_exponentFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[12],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [12])"ct-exponent",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ct-exponent","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetCt_bitsString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetCt_bitsString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetCt_bitsFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [8])"ct-bits",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"ct-bits","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetSurjectionproofString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetSurjectionproofString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetSurjectionproofFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"surjectionproof",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"surjectionproof","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetValuecommitmentString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetValuecommitmentString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetValuecommitmentFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"valuecommitment",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"valuecommitment","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetAssetString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetAssetString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetAssetFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [6])0x5baacb,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"asset","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetAssetcommitmentString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetAssetcommitmentString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetAssetcommitmentFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"assetcommitment",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"assetcommitment","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetCommitmentnonceString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetCommitmentnonceString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetCommitmentnonceFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"commitmentnonce",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"commitmentnonce","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetCommitmentnonce_fully_validString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetCommitmentnonce_fully_validString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetCommitmentnonce_fully_validFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[28],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [28])"commitmentnonce_fully_valid",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"commitmentnonce_fully_valid","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetNString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetNString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetNFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[2],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [2])0x616085,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"n","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetScriptPubKeyString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetScriptPubKeyString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetScriptPubKeyFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[13],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [13])"scriptPubKey",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"scriptPubKey","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    local_f8._8_8_ = 0;
    local_f8._M_unused._M_object = GetRangeproofString_abi_cxx11_;
    local_e8._8_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_e8._0_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_d8[1] = (code *)0x0;
    local_d8[0] = SetRangeproofString;
    pcStack_c0 = std::
                 _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b8[1] = (code *)0x0;
    local_b8[0] = GetRangeproofFieldType_abi_cxx11_;
    pcStack_a0 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
    ::operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_98,
                (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                 *)&local_f8);
    std::function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>::
    operator=((function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)&local_78,
              (function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               *)local_d8);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)&local_58,
              (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
    }
    if ((code *)local_e8._0_8_ != (code *)0x0) {
      (*(code *)local_e8._0_8_)(&local_f8,&local_f8,3);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[11],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [11])"rangeproof",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    local_f8._M_unused._M_object = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"rangeproof","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8);
    if ((undefined1 *)local_f8._M_unused._0_8_ != local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,__destroy_functor);
    }
  }
  return;
}

Assistant:

XpubDataStruct XpubData::ConvertToStruct() const {  // NOLINT
  XpubDataStruct result;
  result.base58 = base58_;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}